

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

int mfseek(mFILE *mf,long offset,int whence)

{
  int *piVar1;
  
  if (whence == 2) {
    offset = offset + mf->size;
  }
  else {
    if (whence == 1) {
      mf->offset = mf->offset + offset;
      goto LAB_0012c101;
    }
    if (whence != 0) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      return -1;
    }
  }
  mf->offset = offset;
LAB_0012c101:
  mf->eof = 0;
  return 0;
}

Assistant:

int mfseek(mFILE *mf, long offset, int whence) {
    switch (whence) {
    case SEEK_SET:
	mf->offset = offset;
	break;
    case SEEK_CUR:
	mf->offset += offset;
	break;
    case SEEK_END:
	mf->offset = mf->size + offset;
	break;
    default:
	errno = EINVAL;
	return -1;
    }

    mf->eof = 0;
    return 0;
}